

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

Symbol __thiscall GrcSymbolTableEntry::BaseLigComponent(GrcSymbolTableEntry *this)

{
  bool bVar1;
  Symbol pGVar2;
  
  do {
    pGVar2 = this;
    this = pGVar2->m_psymtbl->m_psymParent;
    bVar1 = std::operator==(&this->m_staFieldName,"component");
  } while (!bVar1);
  return pGVar2;
}

Assistant:

Symbol GrcSymbolTableEntry::BaseLigComponent()
{
	Assert(FitsSymbolType(ksymtGlyphAttr) ||
		FitsSymbolType(ksymtSlotAttr) ||
		FitsSymbolType(ksymtNonLeafGlyphAttr));

	Symbol psymParent = ParentSymbol();
	Assert(psymParent);
	if (psymParent->m_staFieldName == "component")
		return this;
	else
		return psymParent->BaseLigComponent();
}